

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

bool __thiscall pbrt::BVHAggregate::IntersectP(BVHAggregate *this,Ray *ray,Float tMax)

{
  bool bVar1;
  long lVar2;
  Vector3<float> *in_RDI;
  long *in_FS_OFFSET;
  int i;
  LinearBVHNode *node;
  int nodesVisited;
  int currentNodeIndex;
  int toVisitOffset;
  int nodesToVisit [64];
  int dirIsNeg [3];
  Vector3f invDir;
  float in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  int local_154;
  undefined4 in_stack_fffffffffffffeb8;
  int iVar3;
  int iVar4;
  int iVar5;
  Vector3f *in_stack_fffffffffffffec8;
  Float in_stack_fffffffffffffed4;
  Vector3f *in_stack_fffffffffffffed8;
  Point3f *in_stack_fffffffffffffee0;
  Bounds3<float> *in_stack_fffffffffffffee8;
  uint local_34 [3];
  float local_28;
  float local_24;
  float local_20;
  
  lVar2._0_4_ = in_RDI[3].super_Tuple3<pbrt::Vector3,_float>.y;
  lVar2._4_4_ = in_RDI[3].super_Tuple3<pbrt::Vector3,_float>.z;
  if (lVar2 != 0) {
    Vector3<float>::Vector3(in_RDI,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,0.0);
    local_34[0] = (uint)(local_28 < 0.0);
    local_34[1] = (uint)(local_24 < 0.0);
    local_34[2] = (uint)(local_20 < 0.0);
    iVar5 = 0;
    iVar4 = 0;
    iVar3 = 0;
    while( true ) {
      while( true ) {
        iVar3 = iVar3 + 1;
        lVar2 = *(long *)&in_RDI[3].super_Tuple3<pbrt::Vector3,_float>.y + (long)iVar4 * 0x20;
        bVar1 = Bounds3<float>::IntersectP
                          (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                           in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                           in_stack_fffffffffffffec8,(int *)CONCAT44(iVar5,iVar4));
        if (!bVar1) break;
        if (*(short *)(lVar2 + 0x1c) == 0) {
          if (local_34[*(byte *)(lVar2 + 0x1e)] == 0) {
            *(undefined4 *)(&stack0xfffffffffffffec8 + (long)iVar5 * 4) =
                 *(undefined4 *)(lVar2 + 0x18);
            iVar4 = iVar4 + 1;
          }
          else {
            *(int *)(&stack0xfffffffffffffec8 + (long)iVar5 * 4) = iVar4 + 1;
            iVar4 = *(int *)(lVar2 + 0x18);
          }
          iVar5 = iVar5 + 1;
        }
        else {
          for (local_154 = 0; local_154 < (int)(uint)*(ushort *)(lVar2 + 0x1c);
              local_154 = local_154 + 1) {
            std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::operator[]
                      ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                       &(in_RDI->super_Tuple3<pbrt::Vector3,_float>).z,
                       (long)(*(int *)(lVar2 + 0x18) + local_154));
            bVar1 = PrimitiveHandle::IntersectP
                              ((PrimitiveHandle *)CONCAT44(iVar5,iVar4),
                               (Ray *)CONCAT44(iVar3,in_stack_fffffffffffffeb8),
                               (Float)((ulong)lVar2 >> 0x20));
            if (bVar1) {
              *(long *)(*in_FS_OFFSET + -0x3f8) = (long)iVar3 + *(long *)(*in_FS_OFFSET + -0x3f8);
              return true;
            }
          }
          if (iVar5 == 0) goto LAB_007beeda;
          iVar5 = iVar5 + -1;
          iVar4 = *(int *)(&stack0xfffffffffffffec8 + (long)iVar5 * 4);
        }
      }
      if (iVar5 == 0) break;
      iVar5 = iVar5 + -1;
      iVar4 = *(int *)(&stack0xfffffffffffffec8 + (long)iVar5 * 4);
    }
LAB_007beeda:
    *(long *)(*in_FS_OFFSET + -0x3f8) = (long)iVar3 + *(long *)(*in_FS_OFFSET + -0x3f8);
  }
  return false;
}

Assistant:

bool BVHAggregate::IntersectP(const Ray &ray, Float tMax) const {
    if (nodes == nullptr)
        return false;
    Vector3f invDir(1.f / ray.d.x, 1.f / ray.d.y, 1.f / ray.d.z);
    int dirIsNeg[3] = {static_cast<int>(invDir.x < 0), static_cast<int>(invDir.y < 0),
                       static_cast<int>(invDir.z < 0)};
    int nodesToVisit[64];
    int toVisitOffset = 0, currentNodeIndex = 0;
    int nodesVisited = 0;

    while (true) {
        ++nodesVisited;
        const LinearBVHNode *node = &nodes[currentNodeIndex];
        if (node->bounds.IntersectP(ray.o, ray.d, tMax, invDir, dirIsNeg)) {
            // Process BVH node _node_ for traversal
            if (node->nPrimitives > 0) {
                for (int i = 0; i < node->nPrimitives; ++i) {
                    if (primitives[node->primitivesOffset + i].IntersectP(ray, tMax)) {
                        bvhNodesVisited += nodesVisited;
                        return true;
                    }
                }
                if (toVisitOffset == 0)
                    break;
                currentNodeIndex = nodesToVisit[--toVisitOffset];
            } else {
                if (dirIsNeg[node->axis] != 0) {
                    /// second child first
                    nodesToVisit[toVisitOffset++] = currentNodeIndex + 1;
                    currentNodeIndex = node->secondChildOffset;
                } else {
                    nodesToVisit[toVisitOffset++] = node->secondChildOffset;
                    currentNodeIndex = currentNodeIndex + 1;
                }
            }
        } else {
            if (toVisitOffset == 0)
                break;
            currentNodeIndex = nodesToVisit[--toVisitOffset];
        }
    }
    bvhNodesVisited += nodesVisited;
    return false;
}